

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.c
# Opt level: O1

void fire_effect(void *vo,int level,int dam,int target)

{
  ushort uVar1;
  void *pvVar2;
  OBJ_DATA *pOVar3;
  void *pvVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  CHAR_DATA *ch;
  ROOM_INDEX_DATA *pRoomIndex;
  OBJ_DATA *obj;
  char *format;
  AFFECT_DATA af;
  AFFECT_DATA AStack_98;
  
  if (target == 0) {
    bVar5 = is_affected_by((CHAR_DATA *)vo,0);
    if (!bVar5) {
      iVar6 = level + 3;
      if (-1 < level) {
        iVar6 = level;
      }
      bVar5 = saves_spell(dam / 0x14 + (iVar6 >> 2),(CHAR_DATA *)vo,4);
      if (!bVar5) {
        act("$n is blinded by smoke!",(CHAR_DATA *)vo,(void *)0x0,(void *)0x0,0);
        act("Your eyes tear up from smoke...you can\'t see a thing!",(CHAR_DATA *)vo,(void *)0x0,
            (void *)0x0,3);
        init_affect(&AStack_98);
        AStack_98.where = 0;
        AStack_98.aftype = 0;
        iVar6 = skill_lookup("fire breath");
        AStack_98.type = (short)iVar6;
        AStack_98.level = (short)level;
        iVar6 = number_range(0,level / 10);
        AStack_98.duration = (short)iVar6;
        AStack_98.location = 0x12;
        AStack_98.modifier = -4;
        AStack_98.bitvector[0]._0_1_ = (byte)AStack_98.bitvector[0] | 1;
        affect_to_char((CHAR_DATA *)vo,&AStack_98);
      }
    }
    bVar5 = is_npc((CHAR_DATA *)vo);
    if (!bVar5) {
      gain_condition((CHAR_DATA *)vo,2,dam / 0x14);
    }
    pvVar4 = *(void **)((long)vo + 0x98);
    while (pvVar4 != (void *)0x0) {
      pvVar2 = *(void **)((long)pvVar4 + 8);
      fire_effect(pvVar4,level,dam,1);
      pvVar4 = pvVar2;
    }
  }
  else if (target == 1) {
    bVar5 = is_obj_stat((OBJ_DATA *)vo,0x18);
    if (((!bVar5) && (bVar5 = is_obj_stat((OBJ_DATA *)vo,0xe), !bVar5)) &&
       (iVar6 = number_range(0,4), iVar6 != 0)) {
      iVar6 = level + 3;
      if (-1 < level) {
        iVar6 = level;
      }
      iVar7 = dam / 10 + (iVar6 >> 2);
      iVar6 = (((iVar6 >> 2) + dam / 10) - 0x19U >> 1) + 0x19;
      if (iVar7 < 0x1a) {
        iVar6 = iVar7;
      }
      iVar7 = (iVar6 - 0x32U >> 1) + 0x32;
      if (iVar6 < 0x33) {
        iVar7 = iVar6;
      }
      bVar5 = is_obj_stat((OBJ_DATA *)vo,8);
      iVar6 = iVar7 + -5;
      if (!bVar5) {
        iVar6 = iVar7;
      }
      iVar6 = iVar6 + *(short *)((long)vo + 0x108) * -2;
      uVar1 = *(ushort *)((long)vo + 0x98);
      if (uVar1 < 0xf) {
        switch(uVar1) {
        case 2:
          iVar6 = iVar6 + 0x32;
          format = "$p crackles and burns!";
          break;
        case 3:
          format = "$p sparks and sputters!";
          break;
        case 4:
          iVar6 = iVar6 + 10;
          format = "$p smokes and chars!";
          break;
        default:
          goto switchD_0028c6df_caseD_5;
        case 10:
          iVar6 = iVar6 + 0x19;
          format = "$p bubbles and boils!";
        }
      }
      else if (uVar1 == 0xf) {
        format = "$p ignites and burns!";
      }
      else if (uVar1 == 0x13) {
        format = "$p blackens and crisps!";
      }
      else {
        if (uVar1 != 0x1a) {
          return;
        }
        format = "$p melts and drips!";
      }
      iVar7 = 0x5f;
      if (iVar6 < 0x5f) {
        iVar7 = iVar6;
      }
      iVar6 = 5;
      if (5 < iVar7) {
        iVar6 = iVar7;
      }
      iVar7 = number_percent();
      if (iVar7 <= iVar6) {
        ch = *(CHAR_DATA **)((long)vo + 0x28);
        if ((ch != (CHAR_DATA *)0x0) ||
           ((*(long *)((long)vo + 0x58) != 0 &&
            (ch = *(CHAR_DATA **)(*(long *)((long)vo + 0x58) + 0x18), ch != (CHAR_DATA *)0x0)))) {
          act(format,ch,vo,(void *)0x0,4);
        }
        if (*(OBJ_DATA **)((long)vo + 0x10) != (OBJ_DATA *)0x0) {
          obj = *(OBJ_DATA **)((long)vo + 0x10);
          do {
            pOVar3 = obj->next_content;
            obj_from_obj(obj);
            pRoomIndex = *(ROOM_INDEX_DATA **)((long)vo + 0x58);
            if (pRoomIndex == (ROOM_INDEX_DATA *)0x0) {
              if (*(long *)((long)vo + 0x28) != 0) {
                pRoomIndex = *(ROOM_INDEX_DATA **)(*(long *)((long)vo + 0x28) + 0xa8);
                goto LAB_0028c912;
              }
              extract_obj(obj);
            }
            else {
LAB_0028c912:
              obj_to_room(obj,pRoomIndex);
              fire_effect(obj,level / 2,dam / 2,1);
            }
            obj = pOVar3;
          } while (pOVar3 != (OBJ_DATA *)0x0);
        }
        extract_obj((OBJ_DATA *)vo);
        return;
      }
    }
  }
  else if (target == 2) {
    pvVar4 = *(void **)((long)vo + 0x20);
    while (pvVar4 != (void *)0x0) {
      pvVar2 = *(void **)((long)pvVar4 + 8);
      fire_effect(pvVar4,level,dam,1);
      pvVar4 = pvVar2;
    }
  }
switchD_0028c6df_caseD_5:
  return;
}

Assistant:

void fire_effect(void *vo, int level, int dam, int target)
{
	if (target == TARGET_ROOM) /* nail objects on the floor */
	{
		ROOM_INDEX_DATA *room = (ROOM_INDEX_DATA *)vo;
		OBJ_DATA *obj, *obj_next;

		for (obj = room->contents; obj != nullptr; obj = obj_next)
		{
			obj_next = obj->next_content;
			fire_effect(obj, level, dam, TARGET_OBJ);
		}

		return;
	}

	if (target == TARGET_CHAR) /* do the effect on a victim */
	{
		CHAR_DATA *victim = (CHAR_DATA *)vo;
		OBJ_DATA *obj, *obj_next;

		/* chance of blindness */
		if (!is_affected_by(victim, AFF_BLIND) && !saves_spell(level / 4 + dam / 20, victim, DAM_FIRE))
		{
			AFFECT_DATA af;
			act("$n is blinded by smoke!", victim, nullptr, nullptr, TO_ROOM);
			act("Your eyes tear up from smoke...you can't see a thing!", victim, nullptr, nullptr, TO_CHAR);

			init_affect(&af);
			af.where = TO_AFFECTS;
			af.aftype = AFT_SPELL;
			af.type = skill_lookup("fire breath");
			af.level = level;
			af.duration = number_range(0, level / 10);
			af.location = APPLY_HITROLL;
			af.modifier = -4;
			SET_BIT(af.bitvector, AFF_BLIND);

			affect_to_char(victim, &af);
		}

		/* getting thirsty */
		if (!is_npc(victim))
			gain_condition(victim, COND_THIRST, dam / 20);

		/* let's toast some gear! */
		for (obj = victim->carrying; obj != nullptr; obj = obj_next)
		{
			obj_next = obj->next_content;

			fire_effect(obj, level, dam, TARGET_OBJ);
		}

		return;
	}

	if (target == TARGET_OBJ) /* toast an object */
	{
		OBJ_DATA *obj = (OBJ_DATA *)vo;
		OBJ_DATA *t_obj, *n_obj;
		int chance;
		char *msg;

		if (is_obj_stat(obj, ITEM_BURN_PROOF) || is_obj_stat(obj, ITEM_NOPURGE) || number_range(0, 4) == 0)
			return;

		chance = level / 4 + dam / 10;

		if (chance > 25)
			chance = (chance - 25) / 2 + 25;
		if (chance > 50)
			chance = (chance - 50) / 2 + 50;

		if (is_obj_stat(obj, ITEM_BLESS))
			chance -= 5;
		chance -= obj->level * 2;

		switch (obj->item_type)
		{
			case ITEM_CONTAINER:
				msg = "$p ignites and burns!";
				break;
			case ITEM_POTION:
				chance += 25;
				msg = "$p bubbles and boils!";
				break;
			case ITEM_SCROLL:
				chance += 50;
				msg = "$p crackles and burns!";
				break;
			case ITEM_STAFF:
				chance += 10;
				msg = "$p smokes and chars!";
				break;
			case ITEM_WAND:
				msg = "$p sparks and sputters!";
				break;
			case ITEM_FOOD:
				msg = "$p blackens and crisps!";
				break;
			case ITEM_PILL:
				msg = "$p melts and drips!";
				break;
			default:
				return;
		}

		chance = URANGE(5, chance, 95);

		if (number_percent() > chance)
			return;

		if (obj->carried_by != nullptr)
			act(msg, obj->carried_by, obj, nullptr, TO_ALL);
		else if (obj->in_room != nullptr && obj->in_room->people != nullptr)
			act(msg, obj->in_room->people, obj, nullptr, TO_ALL);

		if (obj->contains)
		{
			/* dump the contents */

			for (t_obj = obj->contains; t_obj != nullptr; t_obj = n_obj)
			{
				n_obj = t_obj->next_content;
				obj_from_obj(t_obj);

				if (obj->in_room != nullptr)
				{
					obj_to_room(t_obj, obj->in_room);
				}
				else if (obj->carried_by != nullptr)
				{
					obj_to_room(t_obj, obj->carried_by->in_room);
				}
				else
				{
					extract_obj(t_obj);
					continue;
				}

				fire_effect(t_obj, level / 2, dam / 2, TARGET_OBJ);
			}
		}

		extract_obj(obj);
	}
}